

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

void duckdb::Executor::VerifyScheduledEventsInternal
               (idx_t vertex,vector<std::reference_wrapper<duckdb::Event>,_true> *vertices,
               vector<bool,_true> *visited,vector<bool,_true> *recursion_stack)

{
  pointer prVar1;
  pointer prVar2;
  pointer prVar3;
  Event *pEVar4;
  pointer puVar5;
  vector<bool,_true> *this;
  const_reference pvVar6;
  unsigned_long *i;
  pointer puVar7;
  const_iterator __end1;
  const_iterator __begin1;
  pointer prVar8;
  reference rVar9;
  vector<unsigned_long,_true> adjacent;
  size_type local_60;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  vector<bool,_true> *local_38;
  
  rVar9 = vector<bool,_true>::get<true>(visited,vertex);
  if ((*rVar9._M_p & rVar9._M_mask) == 0) {
    pvVar6 = vector<std::reference_wrapper<duckdb::Event>,_true>::get<true>(vertices,vertex);
    prVar8 = (pvVar6->_M_data->parents_raw).
             super_vector<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    prVar1 = (pvVar6->_M_data->parents_raw).
             super_vector<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (prVar8 != prVar1) {
      local_58._M_impl.super__Vector_impl_data._M_start = (idx_t *)0x0;
      local_58._M_impl.super__Vector_impl_data._M_finish = (idx_t *)0x0;
      local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      prVar2 = (vertices->
               super_vector<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
               ).
               super__Vector_base<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      prVar3 = (vertices->
               super_vector<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
               ).
               super__Vector_base<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_38 = recursion_stack;
      for (; prVar8 != prVar1; prVar8 = prVar8 + 1) {
        pEVar4 = prVar8->_M_data;
        for (local_60 = 0; local_60 < (ulong)((long)prVar2 - (long)prVar3 >> 3);
            local_60 = local_60 + 1) {
          pvVar6 = vector<std::reference_wrapper<duckdb::Event>,_true>::get<true>(vertices,local_60)
          ;
          if (pvVar6->_M_data == pEVar4) {
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58,&local_60)
            ;
            break;
          }
        }
      }
      rVar9 = vector<bool,_true>::get<true>(visited,vertex);
      this = local_38;
      *rVar9._M_p = *rVar9._M_p | rVar9._M_mask;
      rVar9 = vector<bool,_true>::get<true>(local_38,vertex);
      puVar5 = local_58._M_impl.super__Vector_impl_data._M_finish;
      *rVar9._M_p = *rVar9._M_p | rVar9._M_mask;
      for (puVar7 = local_58._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar5;
          puVar7 = puVar7 + 1) {
        VerifyScheduledEventsInternal(*puVar7,vertices,visited,this);
      }
      rVar9 = vector<bool,_true>::get<true>(this,vertex);
      *rVar9._M_p = *rVar9._M_p & ~rVar9._M_mask;
      ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_58);
    }
  }
  return;
}

Assistant:

void Executor::VerifyScheduledEventsInternal(const idx_t vertex, const vector<reference<Event>> &vertices,
                                             vector<bool> &visited, vector<bool> &recursion_stack) {
	D_ASSERT(!recursion_stack[vertex]); // this vertex is in the recursion stack: circular dependency!
	if (visited[vertex]) {
		return; // early out: we already visited this vertex
	}

	auto &parents = vertices[vertex].get().GetParentsVerification();
	if (parents.empty()) {
		return; // early out: outgoing edges
	}

	// create a vector the indices of the adjacent events
	vector<idx_t> adjacent;
	const idx_t count = vertices.size();
	for (auto parent : parents) {
		idx_t i;
		for (i = 0; i < count; i++) {
			if (RefersToSameObject(vertices[i], parent)) {
				adjacent.push_back(i);
				break;
			}
		}
		D_ASSERT(i != count); // dependency must be in there somewhere
	}

	// mark vertex as visited and add to recursion stack
	visited[vertex] = true;
	recursion_stack[vertex] = true;

	// recurse into adjacent vertices
	for (const auto &i : adjacent) {
		VerifyScheduledEventsInternal(i, vertices, visited, recursion_stack);
	}

	// remove vertex from recursion stack
	recursion_stack[vertex] = false;
}